

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall QGraphicsRectItem::QGraphicsRectItem(QGraphicsRectItem *this,QGraphicsItem *parent)

{
  QGraphicsRectItemPrivate *this_00;
  QAbstractGraphicsShapeItem *in_RSI;
  QAbstractGraphicsShapeItemPrivate *in_RDI;
  
  this_00 = (QGraphicsRectItemPrivate *)operator_new(0x1c8);
  QGraphicsRectItemPrivate::QGraphicsRectItemPrivate(this_00);
  QAbstractGraphicsShapeItem::QAbstractGraphicsShapeItem(in_RSI,in_RDI,(QGraphicsItem *)this_00);
  (in_RDI->super_QGraphicsItemPrivate)._vptr_QGraphicsItemPrivate =
       (_func_int **)&PTR__QGraphicsRectItem_00d328a0;
  return;
}

Assistant:

QGraphicsRectItem::QGraphicsRectItem(QGraphicsItem *parent)
    : QAbstractGraphicsShapeItem(*new QGraphicsRectItemPrivate, parent)
{
}